

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ForceConstraintPS::execute
          (ForceConstraintPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  pointer pnVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  undefined8 uVar11;
  pointer pnVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  type_conflict5 tVar18;
  long lVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  long lVar20;
  int k;
  long lVar21;
  ulong uVar22;
  uint local_578;
  uint local_574;
  cpp_dec_float<50U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  violation;
  cpp_dec_float<50U,_int,_void> local_438;
  uint local_3f8 [2];
  uint auStack_3f0 [2];
  uint local_3e8 [2];
  uint auStack_3e0 [2];
  uint local_3d8 [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  cpp_dec_float<50U,_int,_void> local_348;
  fpclass_type local_308;
  int32_t iStack_304;
  undefined8 uStack_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  basis_col;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  lVar19 = (long)this->m_i;
  if (this->m_i != this->m_old_i) {
    pnVar9 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar9[this->m_old_i].m_backend,&pnVar9[lVar19].m_backend);
    pnVar9 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar9[this->m_old_i].m_backend,&pnVar9[this->m_i].m_backend);
    lVar19 = (long)this->m_i;
    rStatus->data[this->m_old_i] = rStatus->data[lVar19];
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend,&(this->m_lRhs).m_backend)
  ;
  lVar21 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_348,-1.0,(type *)0x0);
  lVar19 = 0x30;
  lVar20 = 0x38;
  local_578 = 0xffffffff;
  local_574 = local_578;
  do {
    if ((this->m_row).
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused <= lVar21) {
      if ((int)local_574 < 0) {
        iVar5 = this->m_i;
        rStatus->data[iVar5] = BASIC;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(y->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend,
                   &(this->m_rowobj).m_backend);
      }
      else {
        uVar22 = (ulong)local_574;
        cStatus->data[uVar22] = BASIC;
        local_148.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
        local_148.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
        local_148.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
        local_148.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
        local_148.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
        local_148.m_backend.exp = (this->m_lRhs).m_backend.exp;
        local_148.m_backend.neg = (this->m_lRhs).m_backend.neg;
        local_148.m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
        local_148.m_backend.prec_elem = (this->m_lRhs).m_backend.prec_elem;
        local_188.m_backend.data._M_elems[0] = (this->m_lhs).m_backend.data._M_elems[0];
        local_188.m_backend.data._M_elems[1] = (this->m_lhs).m_backend.data._M_elems[1];
        local_188.m_backend.data._M_elems[2] = (this->m_lhs).m_backend.data._M_elems[2];
        local_188.m_backend.data._M_elems[3] = (this->m_lhs).m_backend.data._M_elems[3];
        local_188.m_backend.data._M_elems[4] = (this->m_lhs).m_backend.data._M_elems[4];
        local_188.m_backend.data._M_elems[5] = (this->m_lhs).m_backend.data._M_elems[5];
        local_188.m_backend.data._M_elems[6] = (this->m_lhs).m_backend.data._M_elems[6];
        local_188.m_backend.data._M_elems[7] = (this->m_lhs).m_backend.data._M_elems[7];
        local_188.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8);
        local_188.m_backend.exp = (this->m_lhs).m_backend.exp;
        local_188.m_backend.neg = (this->m_lhs).m_backend.neg;
        local_188.m_backend.fpclass = (this->m_lhs).m_backend.fpclass;
        local_188.m_backend.prec_elem = (this->m_lhs).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
        bVar17 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_148,&local_188,&local_110);
        rStatus->data[this->m_i] = (uint)bVar17;
        pNVar10 = (this->m_row).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        lVar19 = (long)(int)local_578;
        local_438.data._M_elems._32_8_ =
             *(undefined8 *)(pNVar10[lVar19].val.m_backend.data._M_elems + 8);
        local_438.data._M_elems._0_8_ = *(undefined8 *)pNVar10[lVar19].val.m_backend.data._M_elems;
        local_438.data._M_elems._8_8_ =
             *(undefined8 *)(pNVar10[lVar19].val.m_backend.data._M_elems + 2);
        puVar1 = pNVar10[lVar19].val.m_backend.data._M_elems + 4;
        local_438.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_438.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_438.exp = pNVar10[lVar19].val.m_backend.exp;
        local_438.neg = pNVar10[lVar19].val.m_backend.neg;
        local_438.fpclass = pNVar10[lVar19].val.m_backend.fpclass;
        local_438.prec_elem = pNVar10[lVar19].val.m_backend.prec_elem;
        violation.m_backend.fpclass = cpp_dec_float_finite;
        violation.m_backend.prec_elem = 10;
        violation.m_backend.data._M_elems[0] = 0;
        violation.m_backend.data._M_elems[1] = 0;
        violation.m_backend.data._M_elems[2] = 0;
        violation.m_backend.data._M_elems[3] = 0;
        violation.m_backend.data._M_elems[4] = 0;
        violation.m_backend.data._M_elems[5] = 0;
        violation.m_backend.data._M_elems._24_5_ = 0;
        violation.m_backend.data._M_elems[7]._1_3_ = 0;
        violation.m_backend.data._M_elems._32_5_ = 0;
        violation.m_backend.data._M_elems[9]._1_3_ = 0;
        violation.m_backend.exp = 0;
        violation.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&violation.m_backend,
                   &(r->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend,&local_438);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((r->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar22),0.0);
        lVar20 = 0;
        for (lVar21 = 0;
            lVar21 < (this->m_row).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused; lVar21 = lVar21 + 1) {
          if ((ulong)local_578 * 0x3c - lVar20 != 0) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->m_row).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data._M_elems + lVar20),&violation.m_backend
                      );
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&(r->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)(&((this->m_row).
                                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .m_elem)->val + 1) + lVar20)].m_backend,&result.m_backend)
            ;
          }
          lVar20 = lVar20 + 0x3c;
        }
        pnVar9 = (this->m_objs).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = *(undefined8 *)(pnVar9[lVar19].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar19].m_backend.data;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar9[lVar19].m_backend.data._M_elems + 2);
        puVar1 = pnVar9[lVar19].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar11 = *(undefined8 *)(puVar1 + 2);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        result.m_backend.exp = pnVar9[lVar19].m_backend.exp;
        result.m_backend.neg = pnVar9[lVar19].m_backend.neg;
        result.m_backend.fpclass = pnVar9[lVar19].m_backend.fpclass;
        result.m_backend.prec_elem = pnVar9[lVar19].m_backend.prec_elem;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::DSVectorBase(&basis_col,
                       (this->m_cols).data.
                       super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar19);
        lVar19 = 0;
        for (lVar20 = 0;
            lVar20 < basis_col.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused; lVar20 = lVar20 + 1) {
          iVar5 = *(int *)((long)(&(basis_col.
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar19);
          if (iVar5 != this->m_i) {
            local_538.fpclass = cpp_dec_float_finite;
            local_538.prec_elem = 10;
            local_538.data._M_elems[0] = 0;
            local_538.data._M_elems[1] = 0;
            local_538.data._M_elems[2] = 0;
            local_538.data._M_elems[3] = 0;
            local_538.data._M_elems[4] = 0;
            local_538.data._M_elems[5] = 0;
            local_538.data._M_elems._24_5_ = 0;
            local_538.data._M_elems[7]._1_3_ = 0;
            local_538.data._M_elems._32_5_ = 0;
            local_538.data._M_elems[9]._1_3_ = 0;
            local_538.exp = 0;
            local_538.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_538,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)((basis_col.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data._M_elems + lVar19),
                       &(y->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar5].m_backend);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result.m_backend,&local_538);
          }
          lVar19 = lVar19 + 0x3c;
        }
        local_538.fpclass = cpp_dec_float_finite;
        local_538.prec_elem = 10;
        local_538.data._M_elems[0] = 0;
        local_538.data._M_elems[1] = 0;
        local_538.data._M_elems[2] = 0;
        local_538.data._M_elems[3] = 0;
        local_538.data._M_elems[4] = 0;
        local_538.data._M_elems[5] = 0;
        local_538.data._M_elems._24_5_ = 0;
        local_538.data._M_elems[7]._1_3_ = 0;
        local_538.data._M_elems._32_5_ = 0;
        local_538.data._M_elems[9]._1_3_ = 0;
        local_538.exp = 0;
        local_538.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_538,&result.m_backend,&local_438);
        iVar5 = this->m_i;
        pnVar9 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pnVar9[iVar5].m_backend.data._M_elems + 8) =
             CONCAT35(local_538.data._M_elems[9]._1_3_,local_538.data._M_elems._32_5_);
        puVar1 = pnVar9[iVar5].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_538.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_538.data._M_elems[7]._1_3_,local_538.data._M_elems._24_5_);
        *(undefined8 *)&pnVar9[iVar5].m_backend.data = local_538.data._M_elems._0_8_;
        *(undefined8 *)(pnVar9[iVar5].m_backend.data._M_elems + 2) = local_538.data._M_elems._8_8_;
        pnVar9[iVar5].m_backend.exp = local_538.exp;
        pnVar9[iVar5].m_backend.neg = local_538.neg;
        pnVar9[iVar5].m_backend.fpclass = local_538.fpclass;
        pnVar9[iVar5].m_backend.prec_elem = local_538.prec_elem;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~DSVectorBase(&basis_col);
      }
      return;
    }
    pNVar10 = (this->m_row).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar4 = *(uint *)((long)(pNVar10->val).m_backend.data._M_elems + lVar20);
    local_438.data._M_elems._32_8_ =
         *(undefined8 *)((long)(pNVar10->val).m_backend.data._M_elems + lVar20 + -0x18);
    puVar1 = (uint *)((long)(&pNVar10->val + -1) + lVar20);
    local_438.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_438.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)(&(pNVar10->val).m_backend.data + -1) + lVar20);
    local_438.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_438.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_438.exp = *(int *)((long)(pNVar10->val).m_backend.data._M_elems + lVar20 + -0x10);
    local_438.neg = *(bool *)((long)(pNVar10->val).m_backend.data._M_elems + lVar20 + -0xc);
    local_438._48_8_ = *(undefined8 *)((long)(pNVar10->val).m_backend.data._M_elems + lVar20 + -8);
    pnVar9 = (this->m_oldLowers).data.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -0x10);
    puVar1 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -0x30);
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -0x20);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    iVar5 = *(int *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -8);
    uVar2 = *(undefined1 *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -4);
    fVar6 = *(fpclass_type *)((long)(pnVar9->m_backend).data._M_elems + lVar19);
    iVar7 = *(int32_t *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + 4);
    pnVar9 = (this->m_oldUppers).data.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3d8._0_8_ = *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -0x10);
    puVar1 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -0x30);
    local_3f8 = *(uint (*) [2])puVar1;
    auStack_3f0 = *(uint (*) [2])(puVar1 + 2);
    puVar1 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -0x20);
    local_3e8 = *(uint (*) [2])puVar1;
    auStack_3e0 = *(uint (*) [2])(puVar1 + 2);
    if ((cStatus->data[(int)uVar4] == FIXED) && ((this->m_fixed).data[lVar21] == true)) {
      iVar8 = *(int *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -8);
      uVar3 = *(undefined1 *)((long)(pnVar9->m_backend).data._M_elems + lVar19 + -4);
      _local_308 = *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + lVar19);
      uStack_300 = 0;
      local_1f8.fpclass = cpp_dec_float_finite;
      local_1f8.prec_elem = 10;
      local_1f8.data._M_elems[0] = 0;
      local_1f8.data._M_elems[1] = 0;
      local_1f8.data._M_elems[2] = 0;
      local_1f8.data._M_elems[3] = 0;
      local_1f8.data._M_elems[4] = 0;
      local_1f8.data._M_elems[5] = 0;
      local_1f8.data._M_elems._24_5_ = 0;
      local_1f8.data._M_elems[7]._1_3_ = 0;
      local_1f8.data._M_elems._32_5_ = 0;
      local_1f8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1f8,
                 &(r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)uVar4].m_backend,&local_438);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&violation,(multiprecision *)&local_1f8,arg);
      pnVar12 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar9 = pnVar12 + (int)uVar4;
      local_238.m_backend.data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      local_238.m_backend.data._M_elems[1] = (pnVar9->m_backend).data._M_elems[1];
      local_238.m_backend.data._M_elems[2] = (pnVar9->m_backend).data._M_elems[2];
      local_238.m_backend.data._M_elems[3] = (pnVar9->m_backend).data._M_elems[3];
      puVar1 = pnVar12[(int)uVar4].m_backend.data._M_elems + 4;
      local_238.m_backend.data._M_elems[4] = *puVar1;
      local_238.m_backend.data._M_elems[5] = puVar1[1];
      local_238.m_backend.data._M_elems[6] = puVar1[2];
      local_238.m_backend.data._M_elems[7] = puVar1[3];
      local_238.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar12[(int)uVar4].m_backend.data._M_elems + 8);
      local_238.m_backend.exp = pnVar12[(int)uVar4].m_backend.exp;
      local_238.m_backend.neg = pnVar12[(int)uVar4].m_backend.neg;
      local_238.m_backend.fpclass = pnVar12[(int)uVar4].m_backend.fpclass;
      local_238.m_backend.prec_elem = pnVar12[(int)uVar4].m_backend.prec_elem;
      local_388.m_backend.data._M_elems._0_8_ = uVar13;
      local_388.m_backend.data._M_elems._8_8_ = uVar14;
      local_388.m_backend.data._M_elems._16_8_ = uVar15;
      local_388.m_backend.data._M_elems._24_8_ = uVar16;
      local_388.m_backend.data._M_elems._32_8_ = uVar11;
      local_388.m_backend.exp = iVar5;
      local_388.m_backend.neg = (bool)uVar2;
      local_388.m_backend.fpclass = fVar6;
      local_388.m_backend.prec_elem = iVar7;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_68);
      bVar17 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_388,&local_238,&local_68);
      cStatus->data[(int)uVar4] = (uint)bVar17;
      tVar18 = boost::multiprecision::operator>
                         (&violation,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_348);
      if (tVar18) {
        pnVar12 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar9 = pnVar12 + (int)uVar4;
        local_278.m_backend.data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        local_278.m_backend.data._M_elems[1] = (pnVar9->m_backend).data._M_elems[1];
        local_278.m_backend.data._M_elems[2] = (pnVar9->m_backend).data._M_elems[2];
        local_278.m_backend.data._M_elems[3] = (pnVar9->m_backend).data._M_elems[3];
        puVar1 = pnVar12[(int)uVar4].m_backend.data._M_elems + 4;
        local_278.m_backend.data._M_elems[4] = *puVar1;
        local_278.m_backend.data._M_elems[5] = puVar1[1];
        local_278.m_backend.data._M_elems[6] = puVar1[2];
        local_278.m_backend.data._M_elems[7] = puVar1[3];
        local_278.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar12[(int)uVar4].m_backend.data._M_elems + 8);
        local_278.m_backend.exp = pnVar12[(int)uVar4].m_backend.exp;
        local_278.m_backend.neg = pnVar12[(int)uVar4].m_backend.neg;
        local_278.m_backend.fpclass = pnVar12[(int)uVar4].m_backend.fpclass;
        local_278.m_backend.prec_elem = pnVar12[(int)uVar4].m_backend.prec_elem;
        local_3c8.m_backend.data._M_elems._0_8_ = uVar13;
        local_3c8.m_backend.data._M_elems._8_8_ = uVar14;
        local_3c8.m_backend.data._M_elems._16_8_ = uVar15;
        local_3c8.m_backend.data._M_elems._24_8_ = uVar16;
        local_3c8.m_backend.data._M_elems._32_8_ = uVar11;
        local_3c8.m_backend.exp = iVar5;
        local_3c8.m_backend.neg = (bool)uVar2;
        local_3c8.m_backend.fpclass = fVar6;
        local_3c8.m_backend.prec_elem = iVar7;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0);
        bVar17 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_3c8,&local_278,&local_a0);
        if (bVar17) {
          pnVar9 = (r->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (*(this->super_PostStep)._vptr_PostStep[6])(&local_538);
          result.m_backend.data._M_elems[0] = local_538.data._M_elems[0];
          result.m_backend.data._M_elems[1] = local_538.data._M_elems[1];
          uVar11 = result.m_backend.data._M_elems._0_8_;
          result.m_backend.data._M_elems[2] = local_538.data._M_elems[2];
          result.m_backend.data._M_elems[3] = local_538.data._M_elems[3];
          result.m_backend.data._M_elems[4] = local_538.data._M_elems[4];
          result.m_backend.data._M_elems[5] = local_538.data._M_elems[5];
          result.m_backend.exp = local_538.exp;
          result.m_backend.neg = local_538.neg;
          result.m_backend.fpclass = local_538.fpclass;
          result.m_backend.prec_elem = local_538.prec_elem;
          result.m_backend.data._M_elems[0] = local_538.data._M_elems[0];
          if (local_538.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_538.neg ^ 1);
          }
          result.m_backend.data._M_elems._0_8_ = uVar11;
          tVar18 = boost::multiprecision::operator<(pnVar9 + (int)uVar4,&result);
          if (!tVar18) goto LAB_002ab0be;
LAB_002ab1cd:
          local_348.data._M_elems[4] = violation.m_backend.data._M_elems[4];
          local_348.data._M_elems[5] = violation.m_backend.data._M_elems[5];
          local_348.data._M_elems[0] = violation.m_backend.data._M_elems[0];
          local_348.data._M_elems[1] = violation.m_backend.data._M_elems[1];
          local_348.data._M_elems[2] = violation.m_backend.data._M_elems[2];
          local_348.data._M_elems[3] = violation.m_backend.data._M_elems[3];
          local_348.exp = violation.m_backend.exp;
          local_348.neg = violation.m_backend.neg;
          local_348.fpclass = violation.m_backend.fpclass;
          local_348.prec_elem = violation.m_backend.prec_elem;
          local_578 = (uint)lVar21;
          local_574 = uVar4;
        }
        else {
LAB_002ab0be:
          local_2b8.m_backend.data._M_elems[8] = local_3d8[0];
          local_2b8.m_backend.data._M_elems[9] = local_3d8[1];
          local_2b8.m_backend.data._M_elems[4] = local_3e8[0];
          local_2b8.m_backend.data._M_elems[5] = local_3e8[1];
          local_2b8.m_backend.data._M_elems[6] = auStack_3e0[0];
          local_2b8.m_backend.data._M_elems[7] = auStack_3e0[1];
          local_2b8.m_backend.data._M_elems[0] = local_3f8[0];
          local_2b8.m_backend.data._M_elems[1] = local_3f8[1];
          local_2b8.m_backend.data._M_elems[2] = auStack_3f0[0];
          local_2b8.m_backend.data._M_elems[3] = auStack_3f0[1];
          local_2b8.m_backend.fpclass = local_308;
          local_2b8.m_backend.prec_elem = iStack_304;
          pnVar12 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar9 = pnVar12 + (int)uVar4;
          local_2f8.m_backend.data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
          local_2f8.m_backend.data._M_elems[1] = (pnVar9->m_backend).data._M_elems[1];
          local_2f8.m_backend.data._M_elems[2] = (pnVar9->m_backend).data._M_elems[2];
          local_2f8.m_backend.data._M_elems[3] = (pnVar9->m_backend).data._M_elems[3];
          puVar1 = pnVar12[(int)uVar4].m_backend.data._M_elems + 4;
          local_2f8.m_backend.data._M_elems[4] = *puVar1;
          local_2f8.m_backend.data._M_elems[5] = puVar1[1];
          local_2f8.m_backend.data._M_elems[6] = puVar1[2];
          local_2f8.m_backend.data._M_elems[7] = puVar1[3];
          local_2f8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar12[(int)uVar4].m_backend.data._M_elems + 8);
          local_2f8.m_backend.exp = pnVar12[(int)uVar4].m_backend.exp;
          local_2f8.m_backend.neg = pnVar12[(int)uVar4].m_backend.neg;
          local_2f8.m_backend.fpclass = pnVar12[(int)uVar4].m_backend.fpclass;
          local_2f8.m_backend.prec_elem = pnVar12[(int)uVar4].m_backend.prec_elem;
          local_2b8.m_backend.exp = iVar8;
          local_2b8.m_backend.neg = (bool)uVar3;
          (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8);
          bVar17 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_2b8,&local_2f8,&local_d8);
          if (bVar17) {
            pnVar9 = (r->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            (*(this->super_PostStep)._vptr_PostStep[6])(&basis_col);
            tVar18 = boost::multiprecision::operator>
                               (pnVar9 + (int)uVar4,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&basis_col);
            if (tVar18) goto LAB_002ab1cd;
          }
        }
      }
    }
    lVar21 = lVar21 + 1;
    lVar19 = lVar19 + 0x38;
    lVar20 = lVar20 + 0x3c;
  } while( true );
}

Assistant:

void SPxMainSM<R>::ForceConstraintPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   s[m_i] = m_lRhs;

   // basis:
   int cBasisCandidate = -1;
   R maxViolation = -1.0;
   int bas_k = -1;

   for(int k = 0; k < m_row.size(); ++k)
   {
      int  cIdx  = m_row.index(k);
      R aij   = m_row.value(k);
      R oldLo = m_oldLowers[k];
      R oldUp = m_oldUppers[k];

      switch(cStatus[cIdx])
      {
      case SPxSolverBase<R>::FIXED:
         if(m_fixed[k])
         {
            assert(EQrel(oldLo, x[cIdx], this->feastol()) || EQrel(oldUp, x[cIdx], this->feastol()));

            R violation = spxAbs(r[cIdx] / aij);

            cStatus[cIdx] = EQrel(oldLo, x[cIdx],
                                  this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;

            if(violation > maxViolation && ((EQrel(oldLo, x[cIdx], this->feastol())
                                             && r[cIdx] < -this->feastol())
                                            || (EQrel(oldUp, x[cIdx], this->feastol()) && r[cIdx] > this->feastol())))
            {
               maxViolation = violation;
               cBasisCandidate = cIdx;
               bas_k = k;
            }
         } // do nothing, if the old bounds are equal, i.e. variable has been not fixed in this row

         break;

      case SPxSolverBase<R>::ON_LOWER:
      case SPxSolverBase<R>::ON_UPPER:
      case SPxSolverBase<R>::BASIC:
         break;

      default:
         break;
      }
   }

   // dual and basis :
   if(cBasisCandidate >= 0)  // one of the variable in the row should in the basis
   {
      assert(EQrel(m_lRhs, m_rhs, this->feastol()) || EQrel(m_lRhs, m_lhs, this->feastol()));
      assert(bas_k >= 0);
      assert(cBasisCandidate == m_row.index(bas_k));

      cStatus[cBasisCandidate] = SPxSolverBase<R>::BASIC;
      rStatus[m_i] = (EQrel(m_lRhs, m_lhs,
                            this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;

      R aij = m_row.value(bas_k);
      R multiplier = r[cBasisCandidate] / aij;
      r[cBasisCandidate] = 0.0;

      for(int k = 0; k < m_row.size(); ++k)  // update the reduced cost
      {
         if(k == bas_k)
         {
            continue;
         }

         r[m_row.index(k)] -= m_row.value(k) * multiplier;
      }

      // compute the value of new dual variable (because we have a new row)
      R val = m_objs[bas_k];
      DSVectorBase<R> basis_col = m_cols[bas_k];

      for(int k = 0; k < basis_col.size(); ++k)
      {
         if(basis_col.index(k) != m_i)
            val -= basis_col.value(k) * y[basis_col.index(k)];
      }

      y[m_i] = val / aij;
   }
   else // slack in the basis
   {
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_rowobj;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM18 Dimension doesn't match after this step.");
   }

#endif
}